

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Int64Range::Int64Range(Int64Range *this,Int64Range *from)

{
  void *pvVar1;
  int64 iVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64Range_003cf5a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar2 = from->maxvalue_;
  this->minvalue_ = from->minvalue_;
  this->maxvalue_ = iVar2;
  return;
}

Assistant:

Int64Range::Int64Range(const Int64Range& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&minvalue_, &from.minvalue_,
    reinterpret_cast<char*>(&maxvalue_) -
    reinterpret_cast<char*>(&minvalue_) + sizeof(maxvalue_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Int64Range)
}